

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ImageFeatureType_EnumeratedImageSizes::ByteSizeLong
          (ImageFeatureType_EnumeratedImageSizes *this)

{
  uint uVar1;
  int iVar2;
  ImageFeatureType_ImageSize *value;
  size_t sVar3;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  ImageFeatureType_EnumeratedImageSizes *this_local;
  
  uVar1 = sizes_size(this);
  _i = (ulong)uVar1;
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = sizes(this,local_20);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ImageFeatureType_ImageSize>(value);
    _i = sVar3 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t ImageFeatureType_EnumeratedImageSizes::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType.EnumeratedImageSizes)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ImageFeatureType.ImageSize sizes = 1;
  {
    unsigned int count = this->sizes_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->sizes(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}